

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDVertex::MaximumFaceEdgeCount(ON_SubDVertex *this)

{
  return 0;
}

Assistant:

unsigned int ON_SubDVertex::MaximumFaceEdgeCount() const
{
  unsigned short max_count = 0;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_edge_count < max_count)
      max_count = f->m_edge_count;
  }
  return max_count;
}